

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGL3DriverBase::draw2DRectangle
          (COpenGL3DriverBase *this,rect<int> *position,SColor colorLeftUp,SColor colorRightUp,
          SColor colorLeftDown,SColor colorRightDown,rect<int> *clip)

{
  bool bVar1;
  u32 uVar2;
  uint extraout_var;
  u32 in_ECX;
  u32 in_EDX;
  vector2d<int> *in_RSI;
  COpenGL3DriverBase *in_RDI;
  u32 in_R9D;
  float fVar3;
  rect<int> *in_stack_00000008;
  S3DVertex vertices [4];
  f32 top;
  f32 down;
  f32 right;
  f32 left;
  dimension2d<unsigned_int> *renderTargetSize;
  rect<int> pos;
  f32 in_stack_fffffffffffffe58;
  f32 in_stack_fffffffffffffe5c;
  COpenGL3DriverBase *in_stack_fffffffffffffe60;
  COpenGL3DriverBase *this_00;
  undefined1 *puVar4;
  COpenGL3DriverBase *pCVar5;
  undefined5 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7d;
  undefined1 in_stack_fffffffffffffe7e;
  undefined1 alpha;
  SColor c;
  undefined1 local_174 [36];
  u32 local_150;
  undefined1 local_14c [36];
  u32 local_128;
  undefined1 local_124 [36];
  u32 local_100;
  undefined1 local_fc [36];
  undefined1 local_d8 [148];
  float local_44;
  float local_40;
  float local_3c;
  dimension2d<unsigned_int> local_38;
  rect<int> local_30 [2];
  SColor local_10;
  SColor local_c;
  SColor local_8;
  SColor local_4;
  
  local_30[0].UpperLeftCorner = *in_RSI;
  local_30[0].LowerRightCorner = in_RSI[1];
  local_10.color = in_R9D;
  local_8.color = in_ECX;
  local_4.color = in_EDX;
  if (in_stack_00000008 != (rect<int> *)0x0) {
    core::rect<int>::clipAgainst(local_30,in_stack_00000008);
  }
  bVar1 = core::rect<int>::isValid(local_30);
  if (bVar1) {
    chooseMaterial2D(in_stack_fffffffffffffe60);
    setMaterialTexture(in_stack_fffffffffffffe60,(u32)in_stack_fffffffffffffe5c,(ITexture *)0x3610a9
                      );
    uVar2 = SColor::getAlpha(&local_4);
    alpha = true;
    if (0xfe < uVar2) {
      uVar2 = SColor::getAlpha(&local_8);
      alpha = true;
      if (0xfe < uVar2) {
        uVar2 = SColor::getAlpha(&local_c);
        alpha = true;
        if (0xfe < uVar2) {
          uVar2 = SColor::getAlpha(&local_10);
          alpha = uVar2 < 0xff;
        }
      }
    }
    setRenderStates2DMode
              (in_RDI,(bool)alpha,(bool)in_stack_fffffffffffffe7e,(bool)in_stack_fffffffffffffe7d);
    local_38.Width = (*(in_RDI->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x3c])();
    local_38.Height = extraout_var;
    local_3c = (float)local_30[0].UpperLeftCorner.X / (float)*(uint *)local_38 +
               (float)local_30[0].UpperLeftCorner.X / (float)*(uint *)local_38 + -1.0;
    local_40 = (float)local_30[0].LowerRightCorner.X / (float)*(uint *)local_38 +
               (float)local_30[0].LowerRightCorner.X / (float)*(uint *)local_38 + -1.0;
    fVar3 = (float)local_30[0].LowerRightCorner.Y / (float)*(uint *)((long)local_38 + 4);
    local_44 = (2.0 - (fVar3 + fVar3)) + -1.0;
    fVar3 = -((float)local_30[0].UpperLeftCorner.Y / (float)*(uint *)((long)local_38 + 4));
    local_d8._144_4_ = (fVar3 + fVar3 + 2.0) - 1.0;
    puVar4 = local_d8 + 0x90;
    pCVar5 = (COpenGL3DriverBase *)local_d8;
    do {
      this_00 = pCVar5;
      S3DVertex::S3DVertex((S3DVertex *)this_00);
      c.color = (u32)((ulong)in_RDI >> 0x20);
      pCVar5 = (COpenGL3DriverBase *)&(this_00->super_CNullDriver).field_0x24;
    } while (pCVar5 != (COpenGL3DriverBase *)puVar4);
    local_100 = local_4.color;
    S3DVertex::S3DVertex
              ((S3DVertex *)
               CONCAT17(alpha,CONCAT16(in_stack_fffffffffffffe7e,
                                       CONCAT15(in_stack_fffffffffffffe7d,in_stack_fffffffffffffe78)
                                      )),(f32)((ulong)pCVar5 >> 0x20),SUB84(pCVar5,0),
               (f32)((ulong)puVar4 >> 0x20),SUB84(puVar4,0),(f32)((ulong)this_00 >> 0x20),
               SUB84(this_00,0),c,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
    memcpy(local_d8,local_fc,0x24);
    local_128 = local_8.color;
    S3DVertex::S3DVertex
              ((S3DVertex *)
               CONCAT17(alpha,CONCAT16(in_stack_fffffffffffffe7e,
                                       CONCAT15(in_stack_fffffffffffffe7d,in_stack_fffffffffffffe78)
                                      )),(f32)((ulong)pCVar5 >> 0x20),SUB84(pCVar5,0),
               (f32)((ulong)puVar4 >> 0x20),SUB84(puVar4,0),(f32)((ulong)this_00 >> 0x20),
               SUB84(this_00,0),c,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
    memcpy(local_d8 + 0x24,local_124,0x24);
    local_150 = local_10.color;
    S3DVertex::S3DVertex
              ((S3DVertex *)
               CONCAT17(alpha,CONCAT16(in_stack_fffffffffffffe7e,
                                       CONCAT15(in_stack_fffffffffffffe7d,in_stack_fffffffffffffe78)
                                      )),(f32)((ulong)pCVar5 >> 0x20),SUB84(pCVar5,0),
               (f32)((ulong)puVar4 >> 0x20),SUB84(puVar4,0),(f32)((ulong)this_00 >> 0x20),
               SUB84(this_00,0),c,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
    memcpy(local_d8 + 0x48,local_14c,0x24);
    S3DVertex::S3DVertex
              ((S3DVertex *)
               CONCAT17(alpha,CONCAT16(in_stack_fffffffffffffe7e,
                                       CONCAT15(in_stack_fffffffffffffe7d,in_stack_fffffffffffffe78)
                                      )),(f32)((ulong)pCVar5 >> 0x20),SUB84(pCVar5,0),
               (f32)((ulong)puVar4 >> 0x20),SUB84(puVar4,0),(f32)((ulong)this_00 >> 0x20),
               SUB84(this_00,0),c,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
    memcpy(local_d8 + 0x6c,local_174,0x24);
    drawQuad(this_00,(VertexType *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
             (S3DVertex (*) [4])0x361419);
  }
  return;
}

Assistant:

void COpenGL3DriverBase::draw2DRectangle(const core::rect<s32> &position,
		SColor colorLeftUp, SColor colorRightUp,
		SColor colorLeftDown, SColor colorRightDown,
		const core::rect<s32> *clip)
{
	core::rect<s32> pos = position;

	if (clip)
		pos.clipAgainst(*clip);

	if (!pos.isValid())
		return;

	chooseMaterial2D();
	setMaterialTexture(0, 0);

	setRenderStates2DMode(colorLeftUp.getAlpha() < 255 ||
								  colorRightUp.getAlpha() < 255 ||
								  colorLeftDown.getAlpha() < 255 ||
								  colorRightDown.getAlpha() < 255,
			false, false);

	const core::dimension2d<u32> &renderTargetSize = getCurrentRenderTargetSize();

	f32 left = (f32)pos.UpperLeftCorner.X / (f32)renderTargetSize.Width * 2.f - 1.f;
	f32 right = (f32)pos.LowerRightCorner.X / (f32)renderTargetSize.Width * 2.f - 1.f;
	f32 down = 2.f - (f32)pos.LowerRightCorner.Y / (f32)renderTargetSize.Height * 2.f - 1.f;
	f32 top = 2.f - (f32)pos.UpperLeftCorner.Y / (f32)renderTargetSize.Height * 2.f - 1.f;

	S3DVertex vertices[4];
	vertices[0] = S3DVertex(left, top, 0, 0, 0, 1, colorLeftUp, 0, 0);
	vertices[1] = S3DVertex(right, top, 0, 0, 0, 1, colorRightUp, 0, 0);
	vertices[2] = S3DVertex(right, down, 0, 0, 0, 1, colorRightDown, 0, 0);
	vertices[3] = S3DVertex(left, down, 0, 0, 0, 1, colorLeftDown, 0, 0);

	drawQuad(vtPrimitive, vertices);
}